

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

roaring64_bitmap_t * roaring64_bitmap_portable_deserialize_safe(char *buf,size_t maxbytes)

{
  roaring64_bitmap_t *dst;
  size_t maxbytes_00;
  roaring_bitmap_t *prVar1;
  undefined1 *in_RSI;
  ulong *in_RDI;
  uint16_t key;
  int i;
  int32_t last_bitmap_key;
  roaring_bitmap_t *bitmap32;
  size_t bitmap32_size;
  uint32_t high32;
  uint64_t bucket;
  int64_t previous_high32;
  roaring64_bitmap_t *r;
  uint64_t buckets;
  size_t read_bytes;
  undefined6 in_stack_ffffffffffffff98;
  ushort in_stack_ffffffffffffff9e;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar2;
  roaring_bitmap_t *local_40;
  ulong local_38;
  roaring_bitmap_t *src;
  undefined1 *puVar3;
  ulong *local_10;
  roaring64_bitmap_t *local_8;
  
  if (in_RDI == (ulong *)0x0) {
    local_8 = (roaring64_bitmap_t *)0x0;
  }
  else if (in_RSI < (undefined1 *)0x8) {
    local_8 = (roaring64_bitmap_t *)0x0;
  }
  else {
    src = (roaring_bitmap_t *)*in_RDI;
    local_10 = in_RDI + 1;
    dst = (roaring64_bitmap_t *)0x8;
    if (src < (roaring_bitmap_t *)0x100000000) {
      local_8 = roaring64_bitmap_create();
      local_38 = 0xffffffffffffffff;
      for (local_40 = (roaring_bitmap_t *)0x0; local_40 < src;
          local_40 = (roaring_bitmap_t *)((long)&(local_40->high_low_container).size + 1)) {
        if (in_RSI < (undefined1 *)((long)&(dst->art).root + 4U)) {
          roaring64_bitmap_free((roaring64_bitmap_t *)previous_high32);
          return (roaring64_bitmap_t *)0x0;
        }
        uVar2 = (uint)*local_10;
        puVar3 = (undefined1 *)((long)&(dst->art).root + 4);
        if ((long)(ulong)uVar2 <= (long)local_38) {
          roaring64_bitmap_free((roaring64_bitmap_t *)previous_high32);
          return (roaring64_bitmap_t *)0x0;
        }
        local_38 = (ulong)uVar2;
        maxbytes_00 = roaring_bitmap_portable_deserialize_size
                                ((char *)CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0),
                                 CONCAT26(in_stack_ffffffffffffff9e,in_stack_ffffffffffffff98));
        if (maxbytes_00 == 0) {
          roaring64_bitmap_free((roaring64_bitmap_t *)previous_high32);
          return (roaring64_bitmap_t *)0x0;
        }
        prVar1 = roaring_bitmap_portable_deserialize_safe
                           ((char *)CONCAT44(uVar2,in_stack_ffffffffffffffb8),maxbytes_00);
        if (prVar1 == (roaring_bitmap_t *)0x0) {
          roaring64_bitmap_free((roaring64_bitmap_t *)previous_high32);
          return (roaring64_bitmap_t *)0x0;
        }
        local_10 = (ulong *)((long)local_10 + maxbytes_00 + 4);
        dst = (roaring64_bitmap_t *)(puVar3 + maxbytes_00);
        in_stack_ffffffffffffffa4 = 0xffffffff;
        for (in_stack_ffffffffffffffa0 = 0;
            in_stack_ffffffffffffffa0 < (prVar1->high_low_container).size;
            in_stack_ffffffffffffffa0 = in_stack_ffffffffffffffa0 + 1) {
          in_stack_ffffffffffffff9e = (prVar1->high_low_container).keys[in_stack_ffffffffffffffa0];
          if ((int)(uint)in_stack_ffffffffffffff9e <= (int)in_stack_ffffffffffffffa4) {
            roaring_bitmap_free((roaring_bitmap_t *)0x141d7e);
            roaring64_bitmap_free((roaring64_bitmap_t *)previous_high32);
            return (roaring64_bitmap_t *)0x0;
          }
          in_stack_ffffffffffffffa4 = (uint)in_stack_ffffffffffffff9e;
        }
        move_from_roaring32_offset(dst,src,(uint32_t)((ulong)local_8 >> 0x20));
        roaring_bitmap_free((roaring_bitmap_t *)0x141dc6);
      }
    }
    else {
      local_8 = (roaring64_bitmap_t *)0x0;
    }
  }
  return local_8;
}

Assistant:

roaring64_bitmap_t *roaring64_bitmap_portable_deserialize_safe(
    const char *buf, size_t maxbytes) {
    // https://github.com/RoaringBitmap/RoaringFormatSpec#extension-for-64-bit-implementations
    if (buf == NULL) {
        return NULL;
    }
    size_t read_bytes = 0;

    // Read as uint64 the distinct number of "buckets", where a bucket is
    // defined as the most significant 32 bits of an element.
    uint64_t buckets;
    if (read_bytes + sizeof(buckets) > maxbytes) {
        return NULL;
    }
    memcpy(&buckets, buf, sizeof(buckets));
    buf += sizeof(buckets);
    read_bytes += sizeof(buckets);

    // Buckets should be 32 bits with 4 bits of zero padding.
    if (buckets > UINT32_MAX) {
        return NULL;
    }

    roaring64_bitmap_t *r = roaring64_bitmap_create();
    // Iterate through buckets ordered by increasing keys.
    int64_t previous_high32 = -1;
    for (uint64_t bucket = 0; bucket < buckets; ++bucket) {
        // Read as uint32 the most significant 32 bits of the bucket.
        uint32_t high32;
        if (read_bytes + sizeof(high32) > maxbytes) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        memcpy(&high32, buf, sizeof(high32));
        buf += sizeof(high32);
        read_bytes += sizeof(high32);
        // High 32 bits must be strictly increasing.
        if (high32 <= previous_high32) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        previous_high32 = high32;

        // Read the 32-bit Roaring bitmaps representing the least
        // significant bits of a set of elements.
        size_t bitmap32_size = roaring_bitmap_portable_deserialize_size(
            buf, maxbytes - read_bytes);
        if (bitmap32_size == 0) {
            roaring64_bitmap_free(r);
            return NULL;
        }

        roaring_bitmap_t *bitmap32 = roaring_bitmap_portable_deserialize_safe(
            buf, maxbytes - read_bytes);
        if (bitmap32 == NULL) {
            roaring64_bitmap_free(r);
            return NULL;
        }
        buf += bitmap32_size;
        read_bytes += bitmap32_size;

        // While we don't attempt to validate much, we must ensure that there
        // is no duplication in the high 48 bits - inserting into the ART
        // assumes (or UB) no duplicate keys. The top 32 bits must be unique
        // because we check for strict increasing values of  high32, but we
        // must also ensure the top 16 bits within each 32-bit bitmap are also
        // at least unique (we ensure they're strictly increasing as well,
        // which they must be for a _valid_ bitmap, since it's cheaper to check)
        int32_t last_bitmap_key = -1;
        for (int i = 0; i < bitmap32->high_low_container.size; i++) {
            uint16_t key = bitmap32->high_low_container.keys[i];
            if (key <= last_bitmap_key) {
                roaring_bitmap_free(bitmap32);
                roaring64_bitmap_free(r);
                return NULL;
            }
            last_bitmap_key = key;
        }

        // Insert all containers of the 32-bit bitmap into the 64-bit bitmap.
        move_from_roaring32_offset(r, bitmap32, high32);
        roaring_bitmap_free(bitmap32);
    }
    return r;
}